

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GetStartOfTableVerifier
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  std::__cxx11::string::operator+=((string *)code_ptr,"\n");
  std::operator+(&local_68,"static public class ",code_ptr_local);
  std::operator+(&local_48,&local_68,"Verify\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::operator+=((string *)local_28,"{\n");
  std::__cxx11::string::operator+=((string *)local_28,"  static public bool Verify");
  std::__cxx11::string::operator+=
            ((string *)local_28,"(Google.FlatBuffers.Verifier verifier, uint tablePos)\n");
  std::__cxx11::string::operator+=((string *)local_28,"  {\n");
  std::__cxx11::string::operator+=
            ((string *)local_28,"    return verifier.VerifyTableStart(tablePos)\n");
  return;
}

Assistant:

void GetStartOfTableVerifier(const StructDef &struct_def,
                               std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\n";
    code += "static public class " + struct_def.name + "Verify\n";
    code += "{\n";
    code += "  static public bool Verify";
    code += "(Google.FlatBuffers.Verifier verifier, uint tablePos)\n";
    code += "  {\n";
    code += "    return verifier.VerifyTableStart(tablePos)\n";
  }